

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O2

void SPARSITY_PREPROC_SYST_CSR(int *colVals,int *rowPtr,int *consP,int NCELLS,int base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int i;
  double *pdVar22;
  Real *pRVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  int n;
  long lVar27;
  long lVar28;
  double *pdVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  undefined4 uVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dStack_730;
  double local_708 [2];
  undefined1 local_6f8 [16];
  double local_6e8;
  double dStack_6e0;
  double dStack_6d8;
  double local_6d0;
  double dStack_6c8;
  double local_6b8 [10];
  GpuArray<double,_9U> conc;
  double dStack_610;
  double local_5c8;
  undefined8 uStack_5c0;
  Real h_RT [9];
  GpuArray<double,_100U> Jac;
  double dStack_150;
  Real c_R [9];
  Real dcRdT [9];
  double dStack_80;
  Real local_78 [9];
  
  pdVar29 = Jac.arr;
  memset(pdVar29,0,800);
  conc.arr[6] = 0.0;
  conc.arr[7] = 0.0;
  conc.arr[4] = 0.0;
  conc.arr[5] = 0.0;
  conc.arr[2] = 0.0;
  conc.arr[3] = 0.0;
  conc.arr[0] = 0.0;
  conc.arr[1] = 0.0;
  conc.arr[8] = 0.0;
  for (lVar27 = 0; dVar84 = conc.arr[3], dVar75 = conc.arr[2], dVar51 = conc.arr[1],
      dVar60 = conc.arr[0], lVar27 != 9; lVar27 = lVar27 + 1) {
    conc.arr[lVar27] = 0.1111111111111111;
  }
  iVar25 = *consP;
  for (lVar27 = 0; lVar27 != 100; lVar27 = lVar27 + 1) {
    Jac.arr[lVar27] = 0.0;
  }
  for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
    local_6b8[lVar27] = 0.0;
  }
  dVar38 = 0.0;
  for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
    dVar38 = dVar38 + conc.arr[lVar27];
  }
  h_RT[0] = 2.911342024497792;
  h_RT[1] = 3.254512984911126;
  h_RT[2] = -15.528347679998124;
  h_RT[3] = 19.481084666666668;
  h_RT[4] = 22.009669090999374;
  h_RT[5] = 5.94295186894925;
  h_RT[6] = 5.3818731557687505;
  h_RT[7] = -5.101694818407498;
  h_RT[8] = 3.0794232161958335;
  dVar67 = conc.arr[2] * 10.0 + conc.arr[1] * -0.21999999999999997 + dVar38 + conc.arr[0];
  dVar44 = conc.arr[1] * conc.arr[3];
  dVar63 = ((dVar67 * 1e-12) / 118698922.25997423) * 1838773899538452.5;
  dVar33 = dVar63 + 1.0;
  dVar56 = log10(dVar63);
  dVar36 = exp(-1.5e+33);
  dVar34 = dVar36 * 0.19999999999999996 + 0.8;
  dVar46 = log10(dVar34);
  dVar35 = dVar46 * -1.27 + 0.75;
  dVar56 = dVar46 * -0.67 + -0.4 + dVar56;
  dVar45 = 1.0 / (dVar56 * -0.14 + dVar35);
  dVar56 = dVar56 * dVar45;
  dVar66 = 1.0 / (dVar56 * dVar56 + 1.0);
  dVar68 = pow(10.0,dVar46 * dVar66);
  dVar52 = conc.arr[7];
  dVar54 = (dVar46 + dVar46) * dVar66 * dVar66 * dVar56 * dVar45;
  dVar45 = -dVar35 * dVar54 * dVar45;
  dVar68 = dVar68 * (dVar63 / dVar33);
  dVar46 = (dVar44 * 118698922.25997423 + conc.arr[6] * -11503468.582662737) * dVar68;
  dVar36 = (dVar44 * 47479.56890398969 + conc.arr[6] * -130017.75806443932) * dVar68 +
           (dVar45 * -0.0006207345732258481 +
            (dVar54 * dVar56 * -1.27 + dVar45 * -0.67 + dVar66) *
            ((dVar36 * 0.19999999999999996) / -1e-30 + -8e-31) * (0.43429448190325176 / dVar34) +
           -0.0006207345732258481 / dVar33) * 2.302585092994046 * dVar46;
  dVar66 = local_6b8[1] - dVar46;
  local_6b8[1] = dVar66;
  dVar63 = local_6b8[3] - dVar46;
  local_6b8[3] = dVar63;
  local_6b8[6] = local_6b8[6] + dVar46;
  dVar34 = dVar68 * 118698922.25997423;
  dVar68 = dVar68 * 11503468.582662737;
  dVar56 = (1.0 / dVar33 + dVar45) * (dVar46 / dVar67);
  if (iVar25 == 0) {
    local_708[0] = dVar56 + dVar56;
    local_708[1] = dVar56 * 0.78 + dVar34 * dVar84;
    local_6f8._8_8_ = dVar34 * dVar51 + dVar56;
    local_6f8._0_8_ = dVar56 * 11.0;
    local_6e8 = dVar56;
    dStack_6e0 = dVar56;
    dStack_6d8 = dVar56 - dVar68;
    local_6d0 = dVar56;
    dStack_6c8 = dVar56;
    pdVar22 = Jac.arr + 1;
    for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
      dVar56 = local_708[lVar27];
      *pdVar22 = *pdVar22 - dVar56;
      pdVar22[2] = pdVar22[2] - dVar56;
      pdVar22[5] = dVar56 + pdVar22[5];
      pdVar22 = pdVar22 + 10;
    }
  }
  else {
    Jac.arr[1] = Jac.arr[1] - dVar56;
    Jac.arr[3] = Jac.arr[3] - dVar56;
    Jac.arr[6] = Jac.arr[6] + dVar56;
    dVar46 = dVar56 * -0.21999999999999997 + dVar34 * dVar84;
    Jac.arr[0xb] = Jac.arr[0xb] - dVar46;
    Jac.arr[0xd] = Jac.arr[0xd] - dVar46;
    Jac.arr[0x10] = dVar46 + Jac.arr[0x10];
    dVar56 = dVar56 * 10.0;
    Jac.arr[0x15] = Jac.arr[0x15] - dVar56;
    Jac.arr[0x17] = Jac.arr[0x17] - dVar56;
    Jac.arr[0x1a] = dVar56 + Jac.arr[0x1a];
    dVar34 = dVar34 * dVar51;
    Jac.arr[0x1f] = Jac.arr[0x1f] - dVar34;
    Jac.arr[0x21] = Jac.arr[0x21] - dVar34;
    Jac.arr[0x24] = dVar34 + Jac.arr[0x24];
    Jac.arr[0x3d] = Jac.arr[0x3d] + dVar68;
    Jac.arr[0x3f] = Jac.arr[0x3f] + dVar68;
    Jac.arr[0x42] = Jac.arr[0x42] - dVar68;
  }
  dVar56 = Jac.arr[0x5b] - dVar36;
  Jac.arr[0x5b] = dVar56;
  dVar45 = Jac.arr[0x5d] - dVar36;
  Jac.arr[0x5d] = dVar45;
  Jac.arr[0x60] = dVar36 + Jac.arr[0x60];
  dVar34 = dVar75 * 11.0 + dVar60 * 1.5 + dVar38;
  dVar38 = ((dVar34 * 1e-06) / 25936106.98548031) * 28231227327.532616;
  dVar36 = log10(dVar38);
  dVar46 = exp(-1.5e+33);
  dVar35 = dVar46 * 0.5 + 0.5;
  dVar68 = log10(dVar35);
  dVar54 = dVar68 * -1.27 + 0.75;
  dVar36 = dVar68 * -0.67 + -0.4 + dVar36;
  dVar37 = 1.0 / (dVar36 * -0.14 + dVar54);
  dVar36 = dVar36 * dVar37;
  dVar33 = 1.0 / (dVar36 * dVar36 + 1.0);
  dVar67 = pow(10.0,dVar68 * dVar33);
  dVar55 = (dVar68 + dVar68) * dVar33 * dVar33 * dVar36 * dVar37;
  dVar37 = -dVar54 * dVar55 * dVar37;
  dVar68 = dVar38 + 1.0;
  dVar67 = (dVar38 / dVar68) * dVar67;
  dVar38 = (dVar52 * 25936106.98548031 + conc.arr[5] * conc.arr[5] * -3419315.29664768) * dVar67;
  dVar36 = (dVar52 * 280925.8837546357 + conc.arr[5] * conc.arr[5] * -591.7471466541167) * dVar67 +
           (dVar37 * -0.0002845931413337665 +
            (dVar55 * dVar36 * -1.27 + dVar37 * -0.67 + dVar33) *
            ((dVar46 * 0.5) / -1e-30 + -4.9999999999999995e-31) * (0.43429448190325176 / dVar35) +
           -0.0002845931413337665 / dVar68) * 2.302585092994046 * dVar38;
  local_6b8[5] = dVar38 + dVar38 + local_6b8[5];
  local_6b8[7] = local_6b8[7] - dVar38;
  local_708[1] = (1.0 / dVar68 + dVar37) * (dVar38 / dVar34);
  dVar38 = dVar67 * 25936106.98548031;
  if (iVar25 == 0) {
    local_708[0] = local_708[1] * 2.5;
    local_6f8._8_8_ = local_708[1];
    local_6f8._0_8_ = local_708[1] * 12.0;
    local_6e8 = local_708[1];
    dStack_6e0 = dVar67 * 3419315.29664768 * -2.0 * conc.arr[5] + local_708[1];
    dStack_6d8 = local_708[1];
    local_6d0 = dVar38 + local_708[1];
    dStack_6c8 = local_708[1];
    pdVar22 = Jac.arr + 7;
    for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
      dVar38 = local_708[lVar27];
      pdVar22[-2] = dVar38 + dVar38 + pdVar22[-2];
      *pdVar22 = *pdVar22 - dVar38;
      pdVar22 = pdVar22 + 10;
    }
  }
  else {
    dVar46 = local_708[1] * 1.5;
    Jac.arr[5] = dVar46 + dVar46 + Jac.arr[5];
    Jac.arr[7] = Jac.arr[7] - dVar46;
    local_708[1] = local_708[1] * 11.0;
    Jac.arr[0x19] = local_708[1] + local_708[1] + Jac.arr[0x19];
    Jac.arr[0x1b] = Jac.arr[0x1b] - local_708[1];
    dVar46 = dVar67 * 3419315.29664768 * -2.0 * conc.arr[5];
    Jac.arr[0x37] = dVar46 + dVar46 + Jac.arr[0x37];
    Jac.arr[0x39] = Jac.arr[0x39] - dVar46;
    Jac.arr[0x4b] = dVar38 + dVar38 + Jac.arr[0x4b];
    Jac.arr[0x4d] = Jac.arr[0x4d] - dVar38;
  }
  Jac.arr[0x5f] = dVar36 + dVar36 + Jac.arr[0x5f];
  Jac.arr[0x61] = Jac.arr[0x61] - dVar36;
  local_708[1] = dVar60 * 1.0145869685785861e-06 + dVar84 * dVar84 * -407.1662961015109;
  dVar36 = dVar34 * local_708[1];
  dVar38 = (dVar60 * 2.2738361995042403e-08 + dVar84 * dVar84 * 0.38915785318430907) * dVar34;
  local_6b8[0] = local_6b8[0] - dVar36;
  local_6b8[3] = dVar36 + dVar36 + dVar63;
  if (iVar25 == 0) {
    local_708[0] = local_708[1] * 2.5 + dVar34 * 1.0145869685785861e-06;
    local_6f8._8_8_ = dVar34 * 407.1662961015109 * -2.0 * dVar84 + local_708[1];
    local_6f8._0_8_ = local_708[1] * 12.0;
    dStack_6d8 = local_708[1];
    local_6d0 = local_708[1];
    local_6e8 = local_708[1];
    dStack_6e0 = local_708[1];
    dStack_6c8 = local_708[1];
    pdVar22 = Jac.arr;
    for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
      dVar63 = local_708[lVar27];
      *pdVar22 = *pdVar22 - dVar63;
      pdVar22[3] = dVar63 + dVar63 + pdVar22[3];
      pdVar22 = pdVar22 + 10;
    }
  }
  else {
    dVar63 = local_708[1] * 1.5 + dVar34 * 1.0145869685785861e-06;
    Jac.arr[0] = Jac.arr[0] - dVar63;
    Jac.arr[3] = dVar63 + dVar63 + Jac.arr[3];
    local_708[1] = local_708[1] * 11.0;
    Jac.arr[0x14] = Jac.arr[0x14] - local_708[1];
    Jac.arr[0x17] = local_708[1] + local_708[1] + Jac.arr[0x17];
    dVar63 = dVar34 * 407.1662961015109 * -2.0 * dVar84;
    Jac.arr[0x1e] = Jac.arr[0x1e] - dVar63;
    Jac.arr[0x21] = dVar63 + dVar63 + Jac.arr[0x21];
  }
  Jac.arr[0x5a] = Jac.arr[0x5a] - dVar38;
  Jac.arr[0x5d] = dVar38 + dVar38 + Jac.arr[0x5d];
  local_6f8._8_8_ =
       conc.arr[4] * conc.arr[4] * 159.17961552912485 + dVar51 * -2.0846475553480232e-08;
  dVar38 = dVar34 * (double)local_6f8._8_8_;
  dVar36 = (conc.arr[4] * conc.arr[4] * -0.05305987184304161 + dVar51 * -5.456888123885079e-10) *
           dVar34;
  local_6b8[1] = dVar66 + dVar38;
  dVar46 = dVar34 * 159.17961552912485;
  dVar63 = dVar34 * 2.0846475553480232e-08;
  if (iVar25 == 0) {
    local_708[0] = (double)local_6f8._8_8_ * 2.5;
    local_708[1] = (double)local_6f8._8_8_ - dVar63;
    local_6f8._0_8_ = (double)local_6f8._8_8_ * 12.0;
    local_6e8 = (dVar46 + dVar46) * conc.arr[4] + (double)local_6f8._8_8_;
    local_6d0 = (double)local_6f8._8_8_;
    dStack_6c8 = (double)local_6f8._8_8_;
    dStack_6e0 = (double)local_6f8._8_8_;
    dStack_6d8 = (double)local_6f8._8_8_;
    pdVar22 = Jac.arr + 1;
    for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
      dVar63 = local_708[lVar27];
      *pdVar22 = *pdVar22 + dVar63;
      pdVar22[3] = pdVar22[3] - (dVar63 + dVar63);
      pdVar22 = pdVar22 + 10;
    }
  }
  else {
    dVar68 = (double)local_6f8._8_8_ * 1.5;
    Jac.arr[1] = Jac.arr[1] + dVar68;
    Jac.arr[4] = Jac.arr[4] - (dVar68 + dVar68);
    Jac.arr[0xb] = Jac.arr[0xb] - dVar63;
    Jac.arr[0xe] = Jac.arr[0xe] - dVar63 * -2.0;
    local_6f8._8_8_ = (double)local_6f8._8_8_ * 11.0;
    Jac.arr[0x15] = Jac.arr[0x15] + (double)local_6f8._8_8_;
    Jac.arr[0x18] = Jac.arr[0x18] - ((double)local_6f8._8_8_ + (double)local_6f8._8_8_);
    dVar63 = (dVar46 + dVar46) * conc.arr[4];
    Jac.arr[0x29] = Jac.arr[0x29] + dVar63;
    Jac.arr[0x2c] = Jac.arr[0x2c] - (dVar63 + dVar63);
  }
  dVar46 = Jac.arr[0x5b] + dVar36;
  Jac.arr[0x5b] = dVar46;
  Jac.arr[0x5e] = Jac.arr[0x5e] - (dVar36 + dVar36);
  local_708[1] = dVar84 * conc.arr[4] * 3142.6666666666665 + conc.arr[5] * -5.646680545093694e-06;
  dVar56 = dVar34 * local_708[1];
  dVar63 = (dVar84 * conc.arr[4] * -2.095111111111111 + conc.arr[5] * -1.262891468371164e-07) *
           dVar34;
  local_6b8[3] = local_6b8[3] - dVar56;
  local_6b8[4] = (local_6b8[4] - (dVar38 + dVar38)) - dVar56;
  local_6b8[5] = dVar56 + local_6b8[5];
  dVar56 = dVar34 * 3142.6666666666665;
  dVar38 = dVar34 * 5.646680545093694e-06;
  if (iVar25 == 0) {
    local_708[0] = local_708[1] * 2.5;
    local_6f8._8_8_ = local_708[1] + conc.arr[4] * dVar56;
    local_6f8._0_8_ = local_708[1] * 12.0;
    local_6e8 = local_708[1] + dVar84 * dVar56;
    dStack_6e0 = local_708[1] - dVar38;
    dStack_6d8 = local_708[1];
    local_6d0 = local_708[1];
    dStack_6c8 = local_708[1];
    pdVar22 = Jac.arr + 5;
    for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
      dVar38 = local_708[lVar27];
      pdVar22[-2] = pdVar22[-2] - dVar38;
      pdVar22[-1] = pdVar22[-1] - dVar38;
      *pdVar22 = dVar38 + *pdVar22;
      pdVar22 = pdVar22 + 10;
    }
  }
  else {
    dVar36 = local_708[1] * 1.5;
    Jac.arr[3] = Jac.arr[3] - dVar36;
    Jac.arr[4] = Jac.arr[4] - dVar36;
    Jac.arr[5] = dVar36 + Jac.arr[5];
    local_708[1] = local_708[1] * 11.0;
    Jac.arr[0x17] = Jac.arr[0x17] - local_708[1];
    Jac.arr[0x18] = Jac.arr[0x18] - local_708[1];
    Jac.arr[0x19] = local_708[1] + Jac.arr[0x19];
    dVar36 = dVar56 * conc.arr[4];
    Jac.arr[0x21] = Jac.arr[0x21] - dVar36;
    Jac.arr[0x22] = Jac.arr[0x22] - dVar36;
    Jac.arr[0x23] = dVar36 + Jac.arr[0x23];
    dVar56 = dVar56 * dVar84;
    Jac.arr[0x2b] = Jac.arr[0x2b] - dVar56;
    Jac.arr[0x2d] = dVar56 + Jac.arr[0x2d];
    Jac.arr[0x2c] = Jac.arr[0x2c] - dVar56;
    Jac.arr[0x35] = dVar38 + Jac.arr[0x35];
    Jac.arr[0x37] = Jac.arr[0x37] - dVar38;
    Jac.arr[0x36] = dVar38 + Jac.arr[0x36];
  }
  Jac.arr[0x5d] = Jac.arr[0x5d] - dVar63;
  dVar36 = Jac.arr[0x5e] - dVar63;
  Jac.arr[0x5e] = dVar36;
  Jac.arr[0x5f] = dVar63 + Jac.arr[0x5f];
  dVar63 = dVar84 * conc.arr[5];
  local_708[1] = dVar63 * 16888.888888888887 + dVar75 * -1.4321870058604512e-06;
  dVar38 = dVar34 * local_708[1];
  dVar75 = (dVar63 * -22.518518518518515 + dVar75 * -3.623660767668382e-08) * dVar34;
  local_6b8[2] = local_6b8[2] + dVar38;
  dVar56 = dVar34 * 16888.888888888887;
  if (iVar25 == 0) {
    local_708[0] = local_708[1] * 2.5;
    dVar68 = local_708[1] + conc.arr[5] * dVar56;
    local_6f8._8_4_ = SUB84(dVar68,0);
    local_6f8._0_8_ = -(dVar34 * 1.4321870058604512e-06) + local_708[1] * 12.0;
    local_6f8._12_4_ = (int)((ulong)dVar68 >> 0x20);
    local_6e8 = local_708[1];
    dStack_6e0 = dVar56 * dVar84 + local_708[1];
    dStack_6d8 = local_708[1];
    local_6d0 = local_708[1];
    dStack_6c8 = local_708[1];
    pdVar22 = Jac.arr + 2;
    lVar27 = 0;
    while( true ) {
      if (lVar27 == 9) break;
      dVar56 = local_708[lVar27];
      *pdVar22 = *pdVar22 + dVar56;
      pdVar22[1] = pdVar22[1] - dVar56;
      pdVar22[3] = pdVar22[3] - dVar56;
      lVar27 = lVar27 + 1;
      pdVar22 = pdVar22 + 10;
    }
  }
  else {
    dVar68 = local_708[1] * 1.5;
    Jac.arr[2] = Jac.arr[2] + dVar68;
    Jac.arr[3] = Jac.arr[3] - dVar68;
    Jac.arr[5] = Jac.arr[5] - dVar68;
    dVar68 = local_708[1] * 11.0 - dVar34 * 1.4321870058604512e-06;
    Jac.arr[0x16] = Jac.arr[0x16] + dVar68;
    Jac.arr[0x17] = Jac.arr[0x17] - dVar68;
    Jac.arr[0x19] = Jac.arr[0x19] - dVar68;
    dVar68 = dVar56 * conc.arr[5];
    Jac.arr[0x21] = Jac.arr[0x21] - dVar68;
    Jac.arr[0x23] = Jac.arr[0x23] - dVar68;
    dVar56 = dVar56 * dVar84;
    Jac.arr[0x34] = Jac.arr[0x34] + dVar56;
    Jac.arr[0x35] = Jac.arr[0x35] - dVar56;
    Jac.arr[0x37] = Jac.arr[0x37] - dVar56;
    Jac.arr[0x20] = Jac.arr[0x20] + dVar68;
  }
  dVar88 = dVar44 * 694956.7634748495 + conc.arr[4] * conc.arr[5] * -9534710.169227276;
  dVar47 = dVar44 * 2391.8538305613447 + conc.arr[4] * conc.arr[5] * 345.9681317415751;
  dVar56 = (local_6b8[3] - dVar38) - dVar88;
  dVar84 = dVar84 * 694956.7634748495;
  dVar51 = dVar51 * 694956.7634748495;
  dVar76 = conc.arr[4] * -9534710.169227276;
  dVar83 = conc.arr[4] * 1860366.9115799016;
  Jac.arr[4] = Jac.arr[4] - dVar83;
  dVar82 = conc.arr[5] * -1341454.8115373214;
  Jac.arr[0x22] = (Jac.arr[0x22] + dVar51) - dVar82;
  dVar35 = conc.arr[0] * 1860366.9115799016;
  dVar68 = conc.arr[5] * -9534710.169227276;
  auVar1._8_4_ = SUB84(Jac.arr[0x29] - dVar68,0);
  auVar1._0_8_ = Jac.arr[0x28] - dVar35;
  auVar1._12_4_ = (int)((ulong)(Jac.arr[0x29] - dVar68) >> 0x20);
  Jac.arr[0x2b] = (Jac.arr[0x2b] - dVar68) + dVar35;
  dVar67 = dVar35 + dVar68 + Jac.arr[0x2d];
  dVar68 = (dVar68 + Jac.arr[0x2c]) - dVar35;
  auVar19._8_4_ = SUB84(dVar67,0);
  auVar19._0_8_ = dVar68;
  auVar19._12_4_ = (int)((ulong)dVar67 >> 0x20);
  uStack_5c0._0_4_ = SUB84(dVar56,0);
  local_5c8 = local_6b8[2];
  uStack_5c0._4_4_ = (int)((ulong)dVar56 >> 0x20);
  dVar64 = conc.arr[5] * 4271828.084344627;
  Jac.arr[2] = dVar64 + Jac.arr[2];
  Jac.arr[5] = (dVar83 + Jac.arr[5]) - dVar64;
  dVar56 = conc.arr[2] * -145376.75098299314;
  dVar67 = dVar56 + (Jac.arr[0x21] - dVar51) + dVar82;
  auVar2._8_4_ = SUB84(dVar67,0);
  auVar2._0_8_ = dVar56 + Jac.arr[0x20];
  auVar2._12_4_ = (int)((ulong)dVar67 >> 0x20);
  dVar48 = conc.arr[3] * -1341454.8115373214;
  dVar67 = conc.arr[3] * -145376.75098299314;
  dVar12 = conc.arr[4] * 86324.17110758815;
  Jac.arr[0x14] = Jac.arr[0x14] - dVar67;
  dVar17 = conc.arr[0] * 4271828.084344627;
  Jac.arr[0x32] = (Jac.arr[0x32] - dVar48) - dVar17;
  Jac.arr[0x18] = Jac.arr[0x18] - dVar12;
  dVar66 = conc.arr[2] * 86324.17110758815;
  Jac.arr[0x2a] = Jac.arr[0x2a] - dVar66;
  Jac.arr[0x2d] = auVar19._8_8_;
  dVar45 = conc.arr[5] * -3658126.0115307234;
  dVar57 = conc.arr[0] * conc.arr[5] * 7577.3366907946565 +
           (0.0017737925172045287 -
           ((h_RT[3] + h_RT[2]) - (h_RT[5] + h_RT[0])) * 0.0006666666666666666) *
           -145376.75098299314 * conc.arr[3] * conc.arr[2];
  dVar61 = dVar60 * conc.arr[4] * 5928.561733942619 +
           (0.0031867701457385282 -
           ((h_RT[5] + h_RT[3]) - (h_RT[4] + h_RT[0])) * 0.0006666666666666666) *
           -1341454.8115373214 * dVar63;
  dVar39 = conc.arr[1] * -0.32384379658070717;
  dVar52 = dVar39 + ((Jac.arr[0] - dVar83) - dVar64);
  auVar3._8_4_ = SUB84(dVar39 + Jac.arr[1],0);
  auVar3._0_8_ = dVar52;
  auVar3._12_4_ = (int)((ulong)(dVar39 + Jac.arr[1]) >> 0x20);
  dVar33 = conc.arr[6] * 12595057.621245861;
  Jac.arr[0x1f] = dVar33 + (Jac.arr[0x1f] - dVar51);
  Jac.arr[0x21] = auVar2._8_8_;
  dVar34 = conc.arr[3] * 12595057.621245861;
  dVar72 = conc.arr[6] * 64119709.90701692;
  dVar73 = conc.arr[5] * -0.6025543492746578;
  dVar69 = conc.arr[5] * -32.62001221218423;
  dVar71 = conc.arr[1] * -0.6025543492746578;
  Jac.arr[0xe] = (dVar84 + Jac.arr[0xe]) - dVar73;
  dVar65 = conc.arr[6] * 32500000.0;
  Jac.arr[0x29] = auVar1._8_8_;
  Jac.arr[0x29] = Jac.arr[0x29] + dVar65;
  Jac.arr[0x28] = Jac.arr[0x28] - dVar35;
  dVar58 = conc.arr[3] * 64119709.90701692;
  dVar62 = conc.arr[4] * 32500000.0;
  dVar86 = conc.arr[6] * conc.arr[3];
  dVar40 = dVar86 * 12595057.621245861 + conc.arr[0] * conc.arr[1] * -0.32384379658070717;
  dVar41 = dVar86 * 2318.3152480739177 +
           (0.00018406547375879315 -
           ((h_RT[0] + h_RT[1]) - (h_RT[3] + h_RT[6])) * 0.0006666666666666666) *
           -0.32384379658070717 * conc.arr[0] * conc.arr[1];
  dVar35 = dVar86 * 4230.445091721601 +
           (6.597729618328551e-05 -
           ((h_RT[5] + h_RT[5]) - (h_RT[3] + h_RT[6])) * 0.0006666666666666666) *
           -16.310006106092114 * conc.arr[5] * conc.arr[5];
  dVar44 = conc.arr[4] * conc.arr[6] * 0.0 +
           (0.0 - ((h_RT[5] + h_RT[1]) - (h_RT[6] + h_RT[4])) * 0.0006666666666666666) *
           -0.6025543492746578 * conc.arr[5] * conc.arr[1];
  auVar4._8_4_ = SUB84(dVar44,0);
  auVar4._0_8_ = dVar35;
  auVar4._12_4_ = (int)((ulong)dVar44 >> 0x20);
  dVar87 = conc.arr[6] * conc.arr[5] * 34143562.115192875 +
           conc.arr[1] * conc.arr[2] * -0.029876205886692417;
  dVar49 = conc.arr[6] * conc.arr[5] * -3795.2266287524203 +
           (-0.00011115497017997593 -
           ((h_RT[1] + h_RT[2]) - (h_RT[5] + h_RT[6])) * 0.0006666666666666666) *
           -0.029876205886692417 * conc.arr[1] * conc.arr[2];
  dVar77 = conc.arr[2] * -0.029876205886692417;
  dVar80 = conc.arr[0] * -0.32384379658070717;
  Jac.arr[10] = dVar80 + Jac.arr[10];
  Jac.arr[0xc] = Jac.arr[0xc] + dVar77;
  Jac.arr[0xd] = (Jac.arr[0xd] - dVar84) - dVar80;
  Jac.arr[0xf] = (dVar84 + Jac.arr[0xf] + dVar73) - dVar77;
  dVar44 = conc.arr[1] * -0.029876205886692417;
  Jac.arr[0x15] = Jac.arr[0x15] + dVar44;
  dVar78 = conc.arr[6] * 15085094.926858293;
  dVar54 = conc.arr[6] * 34143562.115192875;
  Jac.arr[0x33] = (Jac.arr[0x33] - dVar76) + dVar71 + dVar54;
  dVar37 = ((Jac.arr[0x34] + dVar17) - dVar45) + dVar54;
  auVar20._8_4_ = SUB84(dVar37,0);
  auVar20._0_8_ = Jac.arr[0x33];
  auVar20._12_4_ = (int)((ulong)dVar37 >> 0x20);
  dVar18 = conc.arr[5] * 34143562.115192875;
  dVar59 = conc.arr[7] * -4.470666408692084;
  dVar37 = conc.arr[6] * -4323.663734083463;
  uVar43 = (undefined4)((ulong)conc.arr[5] >> 0x20);
  auVar14._8_4_ = SUB84(conc.arr[5],0);
  auVar14._0_8_ = conc.arr[0];
  auVar14._12_4_ = uVar43;
  auVar5._8_4_ = SUB84(conc.arr[7],0);
  auVar5._0_8_ = conc.arr[5];
  auVar5._12_4_ = (int)((ulong)conc.arr[7] >> 0x20);
  dVar70 = conc.arr[7] * -150.1634478502138;
  dVar55 = conc.arr[1] * -150.1634478502138;
  dVar42 = conc.arr[5] * conc.arr[5];
  dVar13 = conc.arr[7] * conc.arr[1];
  dVar85 = conc.arr[6] * conc.arr[6];
  auVar6._8_4_ = SUB84(dVar13,0);
  auVar6._0_8_ = dVar42;
  auVar6._12_4_ = (int)((ulong)dVar13 >> 0x20);
  dVar11 = dVar85 * 20212.492175153773 +
           (0.0026797964842987356 -
           ((h_RT[1] + h_RT[7]) - (h_RT[6] + h_RT[6])) * 0.0006666666666666666) * -150.1634478502138
           * dVar13;
  dVar50 = dVar85 * 7542547.463429146 + dVar13 * -150.1634478502138;
  Jac.arr[0xb] = dVar80 + (Jac.arr[0xb] - dVar84) + dVar73 + dVar77 + dVar70 + dVar59;
  Jac.arr[0x10] =
       ((((Jac.arr[0x10] - dVar80) - dVar73) - dVar77) - (dVar70 + dVar70)) - (dVar59 + dVar59);
  Jac.arr[0x11] = dVar59 + dVar70 + Jac.arr[0x11];
  dVar70 = conc.arr[0] * conc.arr[5] * 4271828.084344627 +
           conc.arr[3] * conc.arr[2] * -145376.75098299314;
  dVar77 = dVar60 * conc.arr[4] * 1860366.9115799016 + dVar63 * -1341454.8115373214;
  dVar84 = conc.arr[4] * conc.arr[2] * 374.95779706744673 +
           (0.00434360147634811 - (h_RT[5] * 2.0 + -(h_RT[4] + h_RT[2])) * 0.0006666666666666666) *
           -1829063.0057653617 * dVar42;
  dVar13 = dVar85 * -81.82756742036453 +
           (-0.0003643959615980579 - (h_RT[6] * -2.0 + h_RT[1] + h_RT[7]) * 0.0006666666666666666) *
           -4.470666408692084 * dVar13;
  auVar15._8_4_ = SUB84(dVar13,0);
  auVar15._0_8_ = dVar84;
  auVar15._12_4_ = (int)((ulong)dVar13 >> 0x20);
  dStack_610 = auVar4._8_8_;
  dVar59 = ((dVar57 + ((Jac.arr[0x5d] - dVar75) - dVar47) + dVar61) - dVar41) - dVar35;
  dVar60 = (((dVar36 + dVar47) - dVar61) - dVar84) - dStack_610;
  dVar36 = dVar86 * 64119709.90701692 + conc.arr[5] * conc.arr[5] * -16.310006106092114;
  dVar80 = conc.arr[4] * conc.arr[6] * 32500000.0 + conc.arr[5] * conc.arr[1] * -0.6025543492746578;
  auVar21._8_4_ = SUB84(dVar60,0);
  auVar21._0_8_ = dVar59;
  auVar21._12_4_ = (int)((ulong)dVar60 >> 0x20);
  dStack_730 = auVar6._8_8_;
  dVar79 = conc.arr[4] * conc.arr[2] * 86324.17110758815 + dVar42 * -1829063.0057653617;
  dVar81 = dVar85 * 224556.7351007675 + dStack_730 * -4.470666408692084;
  dVar74 = uStack_5c0 + dVar77;
  dVar42 = conc.arr[6] * 449113.470201535;
  Jac.arr[0x3d] = dVar34 + Jac.arr[0x3d] + dVar62 + dVar18 + dVar78 + dVar42;
  auVar7._8_4_ = SUB84(conc.arr[5],0);
  auVar7._0_8_ = conc.arr[2];
  auVar7._12_4_ = uVar43;
  dVar73 = conc.arr[5] * -7.112730406981104e-05;
  Jac.arr[0x17] = (Jac.arr[0x17] + dVar67) - dVar73;
  dVar60 = conc.arr[7] * 6362141.693962547;
  Jac.arr[0x23] = dVar72 + dVar72 + ((dVar82 + dVar51 + Jac.arr[0x23]) - dVar56) + dVar60;
  dVar85 = conc.arr[2] * -7.112730406981104e-05;
  Jac.arr[0x34] = auVar20._8_8_;
  Jac.arr[0x35] = (((Jac.arr[0x35] - dVar76) + dVar48 + dVar17) - dVar69) - dVar85;
  dVar86 = conc.arr[1] * -4.470666408692084;
  dVar53 = conc.arr[3] * 6362141.693962547;
  Jac.arr[0x47] = Jac.arr[0x47] + dVar55 + dVar86;
  auVar16._8_4_ = SUB84(Jac.arr[0x48] + dVar53,0);
  auVar16._0_8_ = Jac.arr[0x47];
  auVar16._12_4_ = (int)((ulong)(Jac.arr[0x48] + dVar53) >> 0x20);
  Jac.arr[1] = auVar3._8_8_;
  Jac.arr[0] = dVar52 + dVar37;
  Jac.arr[3] = ((dVar64 + Jac.arr[3] + dVar83) - dVar39) - dVar37;
  Jac.arr[6] = (Jac.arr[6] - dVar39) + dVar37;
  Jac.arr[7] = Jac.arr[7] - dVar37;
  dVar51 = conc.arr[7] * 3347824.3674030215;
  Jac.arr[0x1e] = dVar33 + ((Jac.arr[0x1e] - dVar82) - dVar56) + dVar51;
  Jac.arr[0x21] = (((Jac.arr[0x21] - dVar33) - dVar72) - dVar60) - dVar51;
  Jac.arr[0x20] = dVar56 + Jac.arr[0x20] + dVar60;
  Jac.arr[0x24] = dVar51 + ((Jac.arr[0x24] - dVar33) - dVar72);
  Jac.arr[0x25] = (Jac.arr[0x25] - dVar60) - dVar51;
  dVar51 = conc.arr[7] * 5672469.694980093;
  Jac.arr[0x2d] = dVar51 + dVar66 + dVar66 + Jac.arr[0x2d] + dVar65;
  Jac.arr[0x2c] = ((dVar68 - dVar66) - dVar65) - dVar51;
  Jac.arr[0x2e] = dVar51 + (Jac.arr[0x2e] - dVar65);
  dStack_150 = auVar14._8_8_;
  dVar39 = conc.arr[0] * -4323.663734083463;
  dStack_150 = dStack_150 * -5282.492258864639;
  Jac.arr[0x2f] = Jac.arr[0x2f] - dVar51;
  Jac.arr[0x3c] = dVar34 + Jac.arr[0x3c] + dVar39;
  Jac.arr[0x3f] = ((Jac.arr[0x3f] - dVar34) - dVar58) - dVar39;
  Jac.arr[0x40] = (Jac.arr[0x40] - dVar62) - dStack_150;
  dVar52 = conc.arr[3] * 3347824.3674030215;
  dVar33 = conc.arr[4] * 5672469.694980093;
  Jac.arr[0x46] = Jac.arr[0x46] + dVar52;
  dVar64 = conc.arr[4] * conc.arr[7] * 5672469.694980093 +
           conc.arr[6] * conc.arr[5] * -5282.492258864639;
  dVar37 = conc.arr[4] * conc.arr[7] * 12599.866574880663 +
           (0.0022212311836643283 -
           ((h_RT[6] + h_RT[5]) - (h_RT[4] + h_RT[7])) * 0.0006666666666666666) * -5282.492258864639
           * conc.arr[6] * conc.arr[5];
  local_6b8[4] = ((((local_6b8[4] + dVar88) - dVar77) - dVar79) - dVar80) - dVar64;
  Jac.arr[0x49] = (Jac.arr[0x49] - dVar53) - dVar52;
  auVar8._8_4_ = SUB84(Jac.arr[0x4a] - dVar33,0);
  auVar8._0_8_ = Jac.arr[0x49];
  auVar8._12_4_ = (int)((ulong)(Jac.arr[0x4a] - dVar33) >> 0x20);
  Jac.arr[0x4a] = (double)auVar8._8_8_;
  Jac.arr[0x5e] = auVar21._8_8_;
  dVar65 = conc.arr[2] * -43.95116952269832;
  dVar66 = conc.arr[7] * 1000000.0;
  dVar51 = conc.arr[5] * 1000000.0;
  Jac.arr[0x48] = auVar16._8_8_;
  dVar56 = conc.arr[6] * -5282.492258864639;
  dVar68 = conc.arr[7] * 23496864.50220335;
  dVar63 = conc.arr[6] * -43.95116952269832;
  dVar60 = conc.arr[6] * -1032.714674988212;
  Jac.arr[0x16] = ((Jac.arr[0x16] + dVar67) - dVar12) + dVar44 + dVar73 + dVar63 + dVar60;
  Jac.arr[0x19] =
       ((((dVar12 + dVar12 + (Jac.arr[0x19] - dVar67)) - dVar44) + dVar73) - dVar63) - dVar60;
  Jac.arr[0x1a] = dVar63 + (Jac.arr[0x1a] - dVar44) + dVar60;
  Jac.arr[0x1b] = ((Jac.arr[0x1b] - dVar73) - dVar63) - dVar60;
  Jac.arr[0x36] = ((((Jac.arr[0x36] + dVar76) - dVar48) - dVar45) - dVar71) - dVar56;
  dVar60 = ((((dVar69 + dVar69 + dVar45 + dVar45 + ((dVar48 + dVar76 + Jac.arr[0x37]) - dVar17) +
              dVar71) - dVar54) + dVar85 + dVar56) - dVar66) - dVar68;
  Jac.arr[0x34] = Jac.arr[0x34] + dVar85 + dVar66 + dVar68;
  auVar9._8_4_ = SUB84(dVar60,0);
  auVar9._0_8_ = Jac.arr[0x36];
  auVar9._12_4_ = (int)((ulong)dVar60 >> 0x20);
  Jac.arr[0x37] = (double)auVar9._8_8_;
  Jac.arr[0x38] = (((Jac.arr[0x38] - dVar69) - dVar71) - dVar54) + dVar56 + dVar66 + dVar68;
  Jac.arr[0x39] = (((Jac.arr[0x39] - dVar85) - dVar56) - dVar66) - dVar68;
  dVar60 = conc.arr[2] * -1032.714674988212;
  Jac.arr[0x3e] = Jac.arr[0x3e] + dVar18 + dVar65 + dVar60;
  Jac.arr[0x41] =
       ((((dVar58 + dVar58 + Jac.arr[0x41] + dVar62) - dVar18) + dStack_150) - dVar65) - dVar60;
  Jac.arr[0x42] =
       ((((((Jac.arr[0x42] - dVar34) - dVar58) - dVar62) - dVar18) - (dVar78 + dVar78)) -
       (dVar42 + dVar42)) + dVar39 + dStack_150 + dVar65 + dVar60;
  Jac.arr[0x43] = ((((dVar42 + dVar78 + Jac.arr[0x43]) - dVar39) - dStack_150) - dVar65) - dVar60;
  dVar60 = conc.arr[5] * 23496864.50220335;
  Jac.arr[0x48] = Jac.arr[0x48] + dVar51 + dVar60;
  Jac.arr[0x4b] = ((Jac.arr[0x4b] + dVar53 + dVar33) - dVar51) - dVar60;
  Jac.arr[0x4c] =
       ((Jac.arr[0x4c] - (dVar55 + dVar55)) - (dVar86 + dVar86)) + dVar52 + dVar33 + dVar51 + dVar60
  ;
  Jac.arr[0x4d] =
       (((((dVar55 + Jac.arr[0x4d] + dVar86) - dVar53) - dVar52) - dVar33) - dVar51) - dVar60;
  uStack_5c0 = auVar7._8_8_;
  dVar67 = conc.arr[2] * conc.arr[6];
  dStack_80 = auVar5._8_8_;
  dVar63 = conc.arr[5] * conc.arr[7] * 0.0 +
           (0.0 - ((h_RT[6] + h_RT[2]) - (h_RT[7] + h_RT[5])) * 0.0006666666666666666) *
           -43.95116952269832 * dVar67;
  dVar68 = dStack_80 * conc.arr[3] * 5648.9319335705395 +
           (0.0008878978503309949 -
           ((h_RT[2] + h_RT[5]) - (h_RT[7] + h_RT[3])) * 0.0006666666666666666) *
           -7.112730406981104e-05 * uStack_5c0 * conc.arr[2];
  Jac.arr[0x5b] = auVar15._8_8_ + dVar11 + dVar41 + (dVar46 - dVar47) + dStack_610 + dVar49;
  dVar51 = dVar68 + dVar49 + ((Jac.arr[0x5c] + dVar75 + dVar57) - dVar84);
  auVar10._8_4_ = SUB84(dVar51,0);
  auVar10._0_8_ = Jac.arr[0x5b];
  auVar10._12_4_ = (int)((ulong)dVar51 >> 0x20);
  dVar51 = conc.arr[5] * conc.arr[7] * 50223.15555469926 +
           (0.0021374407444869816 -
           ((h_RT[6] + h_RT[2]) - (h_RT[5] + h_RT[7])) * 0.0006666666666666666) * -1032.714674988212
           * dVar67;
  dVar60 = conc.arr[7] * conc.arr[3] * 5952.53958938735 +
           (0.0017780322191766774 -
           ((h_RT[0] + h_RT[6]) - (h_RT[7] + h_RT[3])) * 0.0006666666666666666) * -4323.663734083463
           * conc.arr[0] * conc.arr[6];
  Jac.arr[0x5a] = dVar41 + ((Jac.arr[0x5a] - dVar61) - dVar57) + dVar60;
  Jac.arr[0x5c] = auVar10._8_8_;
  dVar56 = conc.arr[5] * conc.arr[7] * 1000000.0 + dVar67 * -43.95116952269832;
  dVar46 = dStack_80 * conc.arr[3] * 6362141.693962547 +
           uStack_5c0 * conc.arr[2] * -7.112730406981104e-05;
  local_6b8[1] = dVar40 + (local_6b8[1] - dVar88) + dVar80 + dVar87 + dVar50 + dVar81;
  dVar67 = conc.arr[5] * conc.arr[7] * 23496864.50220335 + dVar67 * -1032.714674988212;
  dVar66 = conc.arr[7] * conc.arr[3] * 3347824.3674030215 +
           conc.arr[0] * conc.arr[6] * -4323.663734083463;
  local_6b8[0] = dVar40 + ((local_6b8[0] - dVar77) - dVar70) + dVar66;
  local_6b8[2] = dVar87 + ((local_6b8[2] + dVar70) - dVar79) + dVar46 + dVar56 + dVar67;
  local_6b8[3] = ((((dVar70 + dVar74) - dVar40) - dVar36) - dVar46) - dVar66;
  local_6b8[5] = ((((dVar36 + dVar36 +
                     dVar79 * 2.0 + ((dVar77 + dVar88 + (local_6b8[5] - dVar38)) - dVar70) + dVar80)
                   - dVar87) + dVar46 + dVar64) - dVar56) - dVar67;
  local_6b8[6] = dVar81 * -2.0 +
                 (((((local_6b8[6] - dVar40) - dVar36) - dVar80) - dVar87) - (dVar50 + dVar50)) +
                 dVar66 + dVar64 + dVar56 + dVar67;
  local_6b8[7] = (((((dVar81 + local_6b8[7] + dVar50) - dVar46) - dVar66) - dVar64) - dVar56) -
                 dVar67;
  Jac.arr[0x5c] = Jac.arr[0x5c] + dVar63 + dVar51;
  Jac.arr[0x5e] = Jac.arr[0x5e] - dVar37;
  Jac.arr[0x5d] = (dVar59 - dVar68) - dVar60;
  Jac.arr[0x5f] =
       ((((dVar35 + dVar35 + dVar84 * 2.0 + ((dVar61 + dVar47 + (Jac.arr[0x5f] - dVar75)) - dVar57)
          + dStack_610) - dVar49) + dVar68 + dVar37) - dVar63) - dVar51;
  Jac.arr[0x60] =
       dVar13 * -2.0 +
       (((((Jac.arr[0x60] - dVar41) - dVar35) - dStack_610) - dVar49) - (dVar11 + dVar11)) + dVar60
       + dVar37 + dVar63 + dVar51;
  Jac.arr[0x61] =
       (((((auVar15._8_8_ + Jac.arr[0x61] + dVar11) - dVar68) - dVar60) - dVar37) - dVar63) - dVar51
  ;
  if (iVar25 == 0) {
    c_R[0] = 2.8916149455543745;
    c_R[1] = 3.3887808219431252;
    c_R[2] = 4.665255136408125;
    c_R[3] = 1.5;
    c_R[4] = 1.506900950283125;
    c_R[5] = 2.9628176357525002;
    c_R[6] = 5.2821630604062495;
    c_R[7] = 7.4795990834;
    c_R[8] = 3.1861205355625004;
    dcRdT[0] = 0.00049010354654;
    dcRdT[1] = 0.000340356715215;
    dcRdT[2] = 0.0011616005819375;
    dcRdT[3] = 0.0;
    dcRdT[4] = -1.20361935e-05;
    dcRdT[5] = 0.00046729736768999996;
    dcRdT[6] = 0.0009643321552500001;
    dcRdT[7] = 0.0013043066091500003;
    dcRdT[8] = 0.00037292866150000014;
    pRVar23 = local_78;
    local_78[0] = 1.9113420244977917;
    local_78[1] = 2.254512984911125;
    local_78[2] = -16.528347679998124;
    local_78[3] = 18.481084666666668;
    local_78[4] = 21.009669090999374;
    local_78[5] = 4.94295186894925;
    local_78[6] = 4.3818731557687505;
    local_78[7] = -6.101694818407498;
    local_78[8] = 2.079423216195834;
  }
  else {
    c_R[0] = 3.8916149455543745;
    c_R[1] = 4.388780821943126;
    c_R[2] = 5.665255136408124;
    c_R[3] = 2.5;
    c_R[4] = 2.506900950283125;
    c_R[5] = 3.9628176357525002;
    c_R[6] = 6.28216306040625;
    c_R[7] = 8.4795990834;
    c_R[8] = 4.1861205355625;
    dcRdT[0] = 0.00049010354654;
    dcRdT[1] = 0.000340356715215;
    dcRdT[2] = 0.0011616005819375;
    dcRdT[3] = 0.0;
    dcRdT[4] = -1.20361935e-05;
    dcRdT[5] = 0.00046729736768999996;
    dcRdT[6] = 0.0009643321552500001;
    dcRdT[7] = 0.0013043066091500003;
    dcRdT[8] = 0.00037292866150000014;
    pRVar23 = h_RT;
  }
  dVar51 = 0.0;
  dVar60 = 0.0;
  dVar84 = 0.0;
  dVar75 = 0.0;
  for (lVar27 = 0; lVar27 != 0x48; lVar27 = lVar27 + 8) {
    dVar38 = *(double *)((long)conc.arr + lVar27);
    dVar84 = dVar84 + *(double *)((long)dcRdT + lVar27) * dVar38;
    dVar63 = *(double *)((long)pRVar23 + lVar27);
    dVar51 = dVar51 + dVar38 * *(double *)((long)c_R + lVar27);
    dVar60 = dVar60 + *(double *)((long)local_6b8 + lVar27) * dVar63;
    dVar75 = dVar75 + (*(double *)((long)c_R + lVar27) - dVar63) * 0.0006666666666666666 *
                      *(double *)((long)local_6b8 + lVar27) +
                      dVar63 * *(double *)((long)Jac.arr + lVar27 + 0x2d0);
  }
  dVar60 = dVar60 * (1.0 / dVar51);
  dVar38 = (1.0 / dVar51) * 1500.0;
  dVar51 = dVar60 * dVar38;
  dVar38 = -dVar38;
  for (lVar27 = 0; lVar27 != 9; lVar27 = lVar27 + 1) {
    dVar63 = 0.0;
    for (lVar28 = 0; lVar28 != 9; lVar28 = lVar28 + 1) {
      dVar63 = dVar63 + pRVar23[lVar28] * pdVar29[lVar28];
    }
    Jac.arr[lVar27 * 10 + 9] = c_R[lVar27] * dVar51 + dVar63 * dVar38;
    pdVar29 = pdVar29 + 10;
  }
  Jac.arr[99] = dVar38 * dVar75 + (dVar51 * dVar84 - dVar60);
  if (base == 1) {
    *rowPtr = 1;
    uVar24 = 0;
    uVar26 = (ulong)(uint)NCELLS;
    if (NCELLS < 1) {
      uVar26 = uVar24;
    }
    iVar25 = 1;
    iVar32 = 1;
    for (; uVar24 != uVar26; uVar24 = uVar24 + 1) {
      lVar27 = 0;
      lVar28 = 0;
      pdVar29 = Jac.arr;
      for (; lVar28 != 10; lVar28 = lVar28 + 1) {
        iVar30 = iVar25;
        for (lVar31 = 0; lVar31 != 800; lVar31 = lVar31 + 0x50) {
          if (lVar27 == lVar31) {
            colVals[(long)iVar32 + -1] = (int)uVar24 * 10 + 1 + (int)lVar28;
LAB_00132891:
            iVar32 = iVar32 + 1;
          }
          else if ((*(double *)((long)pdVar29 + lVar31) != 0.0) ||
                  (NAN(*(double *)((long)pdVar29 + lVar31)))) {
            colVals[(long)iVar32 + -1] = iVar30;
            goto LAB_00132891;
          }
          iVar30 = iVar30 + 1;
        }
        rowPtr[uVar24 * 10 + lVar28 + 1] = iVar32;
        pdVar29 = pdVar29 + 1;
        lVar27 = lVar27 + 0x50;
      }
      iVar25 = iVar25 + 10;
    }
  }
  else {
    *rowPtr = 0;
    iVar25 = 0;
    if (NCELLS < 1) {
      NCELLS = 0;
    }
    iVar32 = 0;
    for (uVar26 = 0; uVar26 != (uint)NCELLS; uVar26 = uVar26 + 1) {
      lVar27 = 0;
      lVar28 = 0;
      pdVar29 = Jac.arr;
      for (; lVar28 != 10; lVar28 = lVar28 + 1) {
        iVar30 = iVar25;
        for (lVar31 = 0; lVar31 != 800; lVar31 = lVar31 + 0x50) {
          if (lVar27 == lVar31) {
            colVals[iVar32] = (int)lVar28 + (int)uVar26 * 10;
LAB_00132936:
            iVar32 = iVar32 + 1;
          }
          else if ((*(double *)((long)pdVar29 + lVar31) != 0.0) ||
                  (NAN(*(double *)((long)pdVar29 + lVar31)))) {
            colVals[iVar32] = iVar30;
            goto LAB_00132936;
          }
          iVar30 = iVar30 + 1;
        }
        rowPtr[uVar26 * 10 + lVar28 + 1] = iVar32;
        pdVar29 = pdVar29 + 1;
        lVar27 = lVar27 + 0x50;
      }
      iVar25 = iVar25 + 10;
    }
  }
  return;
}

Assistant:

void
SPARSITY_PREPROC_SYST_CSR(
  int* colVals, int* rowPtr, const int* consP, int NCELLS, int base)
{
  amrex::GpuArray<amrex::Real, 100> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 9> conc = {0.0};
  for (int n = 0; n < 9; n++) {
    conc[n] = 1.0 / 9.000000;
  }
  aJacobian(&Jac[0], &conc[0], 1500.0, *consP);

  if (base == 1) {
    rowPtr[0] = 1;
    int nJdata_tmp = 1;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 10;
      for (int l = 0; l < 10; l++) {
        for (int k = 0; k < 10; k++) {
          if (k == l) {
            colVals[nJdata_tmp - 1] = l + 1 + offset;
            nJdata_tmp = nJdata_tmp + 1;
          } else {
            if (Jac[10 * k + l] != 0.0) {
              colVals[nJdata_tmp - 1] = k + 1 + offset;
              nJdata_tmp = nJdata_tmp + 1;
            }
          }
        }
        rowPtr[offset + (l + 1)] = nJdata_tmp;
      }
    }
  } else {
    rowPtr[0] = 0;
    int nJdata_tmp = 0;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 10;
      for (int l = 0; l < 10; l++) {
        for (int k = 0; k < 10; k++) {
          if (k == l) {
            colVals[nJdata_tmp] = l + offset;
            nJdata_tmp = nJdata_tmp + 1;
          } else {
            if (Jac[10 * k + l] != 0.0) {
              colVals[nJdata_tmp] = k + offset;
              nJdata_tmp = nJdata_tmp + 1;
            }
          }
        }
        rowPtr[offset + (l + 1)] = nJdata_tmp;
      }
    }
  }
}